

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cxx
# Opt level: O2

int main(void)

{
  server_t s;
  allocator<char> local_37a;
  allocator<char> local_379;
  string local_378;
  string local_358;
  _Any_data local_338;
  code *local_328;
  code *local_320;
  _Any_data local_318;
  code *local_308;
  code *local_300;
  server_t local_2f0;
  
  clask::server_t::server_t(&local_2f0);
  clask::logger::default_level = 2;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"/files",&local_379);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"./files",&local_37a);
  clask::server_t::static_dir(&local_2f0,&local_378,&local_358,false);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"/",&local_379);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_358,"./public",&local_37a);
  clask::server_t::static_dir(&local_2f0,&local_378,&local_358,false);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"/api",(allocator<char> *)&local_358);
  local_318._M_unused._M_object = (void *)0x0;
  local_318._8_8_ = 0;
  local_300 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/upload/main.cxx:32:17)>
              ::_M_invoke;
  local_308 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/upload/main.cxx:32:17)>
              ::_M_manager;
  clask::server_t::GET(&local_2f0,&local_378,(functor_string *)&local_318);
  std::_Function_base::~_Function_base((_Function_base *)&local_318);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"/upload",(allocator<char> *)&local_358);
  local_338._M_unused._M_object = (void *)0x0;
  local_338._8_8_ = 0;
  local_320 = std::
              _Function_handler<clask::response_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/upload/main.cxx:42:21)>
              ::_M_invoke;
  local_328 = std::
              _Function_handler<clask::response_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/example/upload/main.cxx:42:21)>
              ::_M_manager;
  clask::server_t::POST(&local_2f0,&local_378,(functor_response *)&local_338);
  std::_Function_base::~_Function_base((_Function_base *)&local_338);
  std::__cxx11::string::~string((string *)&local_378);
  clask::server_t::run(&local_2f0,0x1f90);
  clask::server_t::~server_t(&local_2f0);
  return 0;
}

Assistant:

int main() {
  auto s = clask::server();
  s.log.default_level = clask::log_level::INFO;
  s.static_dir("/files", "./files");
  s.static_dir("/", "./public");
  s.GET("/api", [](clask::request&) {
    nlohmann::json data;
    int n = 0;
    for (const auto& e : std::filesystem::directory_iterator("files")) {
      auto fn = e.path().filename().u8string();
      if (fn[0] == '.') continue;
      data[n++] = fn;
    }
    return data.dump();
  });
  s.POST("/upload", [](clask::request& req) -> clask::response {
    std::vector<clask::part> parts;
    if (req.header_value("expect") == "100-continue") {
      return clask::response {
        .code = 100,
      };
    }
    if (!req.parse_multipart(parts) || parts.size() == 0) {
      return clask::response {
        .code = 400,
        .content = "Bad Request",
      };
    }
    for (auto part : parts) {
      if (!save_file(part)) {
        return clask::response {
          .code = 400,
          .content = "Bad Request",
        };
      }
    }
    return clask::response {
      .code = 302,
      .content = "",
      .headers = {
        {"Location", "/"},
      },
    };
  });
  s.run();
}